

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

bool NscPushDefaultValue(CNscPStackEntry *pOut,NscType nType)

{
  bool bVar1;
  NscType nType_00;
  
  switch(nType) {
  case NscType_Integer:
    CNscPStackEntry::PushConstantInteger(pOut,0);
    nType_00 = NscType_Integer;
    break;
  case NscType_Float:
    CNscPStackEntry::PushConstantFloat(pOut,0.0);
    nType_00 = NscType_Float;
    break;
  case NscType_String:
    CNscPStackEntry::PushConstantString(pOut,"",0);
    nType_00 = NscType_String;
    break;
  case NscType_Object:
    CNscPStackEntry::PushConstantObject(pOut,1);
    nType_00 = NscType_Object;
    break;
  case NscType_Vector:
    CNscPStackEntry::PushConstantVector(pOut,0.0,0.0,0.0);
    nType_00 = NscType_Vector;
    break;
  case NscType_Vector|NscType_Void:
  case NscType_String|NscType_Statement:
  case NscType_String|NscType_Struct:
  case NscType_String|NscType_Integer:
  case NscType_String|NscType_Float:
  case NscType_Engine_0:
  case NscType_Engine_1:
switchD_00158dfa_caseD_b:
    nType_00 = NscType_Error;
    bVar1 = false;
    if ((0x1f < (int)nType) && (bVar1 = false, (int)(nType - NscType_Struct_0) < g_pCtx->m_nStructs)
       ) {
      CNscPStackEntry::PushConstantStructure(pOut,nType);
      bVar1 = true;
      nType_00 = nType;
    }
    goto LAB_00158ecb;
  case NscType_Engine_2:
    CNscPStackEntry::PushConstantLocation(pOut,0);
    nType_00 = NscType_Engine_2;
    break;
  default:
    if (nType != NscType_Engine_7) goto switchD_00158dfa_caseD_b;
    CNscPStackEntry::PushConstantJson(pOut,"",-1);
    nType_00 = NscType_Engine_7;
  }
  bVar1 = true;
LAB_00158ecb:
  CNscPStackEntry::SetType(pOut,nType_00);
  return bVar1;
}

Assistant:

bool NscPushDefaultValue (CNscPStackEntry *pOut, NscType nType)
{
	switch (nType)
	{

		case NscType_Integer:
			pOut ->PushConstantInteger (0);
			pOut ->SetType (NscType_Integer);
			return true;

		case NscType_Float:
			pOut ->PushConstantFloat (0.0f);
			pOut ->SetType (NscType_Float);
			return true;

		case NscType_String:
			pOut ->PushConstantString ("", 0);
			pOut ->SetType (NscType_String);
			return true;

		case NscType_Engine_2:
			pOut ->PushConstantLocation(LOCATION_PRESET_INVALID);
			pOut ->SetType (NscType_Engine_2);
			return true;

		case NscType_Engine_7:
			pOut ->PushConstantJson ("");
			pOut ->SetType (NscType_Engine_7);
			return true;

		case NscType_Object:
			pOut ->PushConstantObject (1); // OBJECT_INVALID
			pOut ->SetType (NscType_Object);
			return true;

		case NscType_Vector:
			pOut ->PushConstantVector (0.0f, 0.0f, 0.0f);
			pOut ->SetType (NscType_Vector);
			return true;

		default:

			//
			// If this is a structure type
			//

			if (g_pCtx ->IsStructure (nType))
			{
				pOut ->PushConstantStructure (nType);
				pOut ->SetType (nType);
				return true;
			}

			pOut ->SetType (NscType_Error);
			return false;

	}
}